

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPI.cpp
# Opt level: O2

int __thiscall SPI::open(SPI *this,char *__file,int __oflag,...)

{
  int iVar1;
  invalid_argument *this_00;
  char *pcVar2;
  int *piVar3;
  error_code *peVar4;
  uint in_ECX;
  code *pcVar5;
  undefined *puVar6;
  int mode_local;
  int speed_local;
  undefined4 local_48;
  undefined8 local_40;
  char spiDev [32];
  
  mode_local = in_ECX;
  speed_local = __oflag;
  if (this->_fd == -1) {
    if (in_ECX < 4) {
      snprintf(spiDev,0x20,_spiDevTemplate,(ulong)__file & 0xffffffff);
      iVar1 = ::open(spiDev,2);
      this->_fd = iVar1;
      if (iVar1 < 0) {
        pcVar2 = (char *)__cxa_allocate_exception(0x20);
        piVar3 = __errno_location();
        peVar4 = (error_code *)strerror(*piVar3);
        local_40 = std::iostream_category();
        local_48 = 1;
        std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
        __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      iVar1 = ioctl(iVar1,0x40016b01,&mode_local);
      if (iVar1 < 0) {
        pcVar2 = (char *)__cxa_allocate_exception(0x20);
        piVar3 = __errno_location();
        peVar4 = (error_code *)strerror(*piVar3);
        local_40 = std::iostream_category();
        local_48 = 1;
        std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
        __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      iVar1 = ioctl(this->_fd,0x40016b03,"\b3SPI");
      if (iVar1 < 0) {
        pcVar2 = (char *)__cxa_allocate_exception(0x20);
        piVar3 = __errno_location();
        peVar4 = (error_code *)strerror(*piVar3);
        local_40 = std::iostream_category();
        local_48 = 1;
        std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
        __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      iVar1 = ioctl(this->_fd,0x40046b04,&speed_local);
      if (-1 < iVar1) {
        return iVar1;
      }
      pcVar2 = (char *)__cxa_allocate_exception(0x20);
      piVar3 = __errno_location();
      peVar4 = (error_code *)strerror(*piVar3);
      local_40 = std::iostream_category();
      local_48 = 1;
      std::ios_base::failure[abi:cxx11]::failure(pcVar2,peVar4);
      __cxa_throw(pcVar2,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Wrong \'mode\' parameter to open SPI channel");
    puVar6 = &std::invalid_argument::typeinfo;
    pcVar5 = std::invalid_argument::~invalid_argument;
  }
  else {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x20);
    spiDev._8_8_ = std::iostream_category();
    spiDev[0] = '\x01';
    spiDev[1] = '\0';
    spiDev[2] = '\0';
    spiDev[3] = '\0';
    std::ios_base::failure[abi:cxx11]::failure
              ((char *)this_00,(error_code *)"SPI is already opened");
    puVar6 = &std::ios_base::failure[abi:cxx11]::typeinfo;
    pcVar5 = std::ios_base::failure[abi:cxx11]::~failure;
  }
  __cxa_throw(this_00,puVar6,pcVar5);
}

Assistant:

void SPI::open(int channel, int speed, int mode) {
    if (_fd != -1)
        throw std::ios_base::failure("SPI is already opened");
    if (mode < 0 || mode > 3)
        throw std::invalid_argument("Wrong 'mode' parameter to open SPI channel");
    char spiDev[32];
    ::snprintf(spiDev, sizeof(spiDev), _spiDevTemplate, channel);
    if ((_fd = ::open(spiDev, O_RDWR)) < 0)
        throw std::ios_base::failure(::strerror(errno));
    if (::ioctl(_fd, SPI_IOC_WR_MODE, &mode) < 0)
        throw std::ios_base::failure(::strerror(errno));

    if (::ioctl(_fd, SPI_IOC_WR_BITS_PER_WORD, &_spiBPW) < 0)
        throw std::ios_base::failure(::strerror(errno));

    if (::ioctl(_fd, SPI_IOC_WR_MAX_SPEED_HZ, &speed) < 0)
        throw std::ios_base::failure(::strerror(errno));

}